

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

size_t mbedtls_mpi_lsb(mbedtls_mpi *X)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  
  lVar1 = 0;
  sVar2 = 0;
  do {
    if (sVar2 == X->n) {
      return 0;
    }
    for (uVar3 = 0; uVar3 != 0x40; uVar3 = uVar3 + 1) {
      if ((X->p[sVar2] >> (uVar3 & 0x3f) & 1) != 0) {
        return uVar3 - lVar1;
      }
    }
    sVar2 = sVar2 + 1;
    lVar1 = lVar1 + -0x40;
  } while( true );
}

Assistant:

size_t mbedtls_mpi_lsb( const mbedtls_mpi *X )
{
    size_t i, j, count = 0;
    MBEDTLS_INTERNAL_VALIDATE_RET( X != NULL, 0 );

    for( i = 0; i < X->n; i++ )
        for( j = 0; j < biL; j++, count++ )
            if( ( ( X->p[i] >> j ) & 1 ) != 0 )
                return( count );

    return( 0 );
}